

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall
wabt::interp::Thread::DoBinop<long,long>(Thread *this,BinopTrapFunc<long,_long> *f,Ptr *out_trap)

{
  RunResult RVar1;
  long lVar2;
  long lVar3;
  Ptr local_78;
  undefined1 local_60 [8];
  string msg;
  long out;
  long lhs;
  long rhs;
  Ptr *out_trap_local;
  BinopTrapFunc<long,_long> *f_local;
  Thread *this_local;
  
  lVar2 = Pop<long>(this);
  lVar3 = Pop<long>(this);
  std::__cxx11::string::string((string *)local_60);
  RVar1 = (*f)(lVar3,lVar2,(long *)(msg.field_2._M_local_buf + 8),(string *)local_60);
  if (RVar1 == Trap) {
    Trap::New(&local_78,this->store_,(string *)local_60,&this->frames_);
    RefPtr<wabt::interp::Trap>::operator=(out_trap,&local_78);
    this_local._4_4_ = Trap;
    RefPtr<wabt::interp::Trap>::~RefPtr(&local_78);
  }
  else {
    Push<long>(this,msg.field_2._8_8_);
    this_local._4_4_ = Ok;
  }
  std::__cxx11::string::~string((string *)local_60);
  return this_local._4_4_;
}

Assistant:

RunResult Thread::DoBinop(BinopTrapFunc<R, T> f, Trap::Ptr* out_trap) {
  auto rhs = Pop<T>();
  auto lhs = Pop<T>();
  T out;
  std::string msg;
  TRAP_IF(f(lhs, rhs, &out, &msg) == RunResult::Trap, msg);
  Push<R>(out);
  return RunResult::Ok;
}